

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O1

int find_sender(node_info *info,int num_proc,int recv_node,int tile,int display_node,int num_tiles,
               IceTBoolean *all_contained_tmasks)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  if (num_proc < 1) {
    uVar4 = 0xffffffff;
  }
  else {
    piVar3 = &info[(ulong)(uint)num_proc - 1].tile_receiving;
    uVar4 = 0xffffffff;
    uVar5 = (ulong)(uint)num_proc;
    do {
      if (((piVar3[-1] < 0) &&
          (all_contained_tmasks[((node_info *)(piVar3 + -4))->rank * num_tiles + tile] != '\0')) &&
         ((ulong)(uint)recv_node + 1 != uVar5 &&
          (((node_info *)(piVar3 + -4))->rank != display_node && *piVar3 != tile))) {
        if (piVar3[-2] == tile) {
          uVar4 = (int)uVar5 - 1;
          break;
        }
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar5 - 1;
        }
      }
      piVar3 = piVar3 + -7;
      bVar1 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
  }
  if ((int)uVar4 < 0) {
    iVar2 = 0;
  }
  else {
    info[recv_node].tile_held = tile;
    info[recv_node].tile_receiving = tile;
    iVar2 = info[uVar4].rank;
    info[recv_node].recv_src = iVar2;
    info[uVar4].tile_sending = tile;
    info[uVar4].send_dest = info[recv_node].rank;
    if (info[uVar4].tile_held == tile) {
      info[uVar4].tile_held = -1;
    }
    info[uVar4].num_contained = info[uVar4].num_contained + -1;
    all_contained_tmasks[iVar2 * num_tiles + tile] = '\0';
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int find_sender(struct node_info *info, int num_proc,
                       int recv_node, int tile,
                       int display_node, int num_tiles,
                       IceTBoolean *all_contained_tmasks)
{
    int send_node;
    int sender = -1;

    for (send_node = num_proc-1; send_node >= 0; send_node--) {
        if (   (info[send_node].tile_sending >= 0)
            || !CONTAINS_TILE(send_node, tile)
            || (info[send_node].tile_receiving == tile)
            || (info[send_node].rank == display_node)
            || (send_node == recv_node) ) {
            continue;
        }
        if (info[send_node].tile_held == tile) {
          /* Favor sending held images. */
            sender = send_node;
            break;
        } else if (sender < 0) {
            sender = send_node;
        }
    }
    
    if (sender >= 0) {
        info[recv_node].tile_held = tile;
        info[recv_node].tile_receiving = tile;
        info[recv_node].recv_src = info[sender].rank;
        info[sender].tile_sending = tile;
        info[sender].send_dest = info[recv_node].rank;
        if (info[sender].tile_held == tile) info[sender].tile_held = -1;
        info[sender].num_contained--;
        all_contained_tmasks[info[sender].rank*num_tiles + tile] = 0;
        return 1;
    } else {
        return 0;
    }
}